

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O3

void IremGA20_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  
  __s = *outputs;
  __s_00 = outputs[1];
  lVar4 = *(long *)((long)param + 0x20);
  if (lVar4 != 0) {
    if (samples != 0) {
      uVar6 = 0;
      do {
        lVar8 = 0;
        iVar7 = 0;
        do {
          if ((*(char *)((long)param + lVar8 + 0x65) == '\0') &&
             (*(char *)((long)param + lVar8 + 100) != '\0')) {
            iVar5 = (int)*(char *)((long)param + lVar8 + 0x66);
            if (*(char *)((long)param + 0xbc) == '\0') {
              iVar5 = (uint)*(ushort *)((long)param + lVar8 + 0x60) * iVar5;
              iVar9 = *(int *)((long)param + lVar8 + 0x58);
            }
            else {
              iVar9 = *(int *)((long)param + lVar8 + 0x58);
              iVar5 = (int)((uint)*(ushort *)((long)param + lVar8 + 0x60) *
                           (*(char *)((long)param + lVar8 + 0x67) * iVar9 +
                           (0x10000 - iVar9) * iVar5)) >> 0x10;
            }
            iVar7 = iVar7 + iVar5;
            *(int *)((long)param + lVar8 + 0x58) = iVar9 + *(int *)((long)param + lVar8 + 0x5c);
            pcVar2 = (char *)((long)param + lVar8 + 99);
            *pcVar2 = *pcVar2 + '\x01';
            if (*pcVar2 == '\0') {
              iVar5 = *(int *)((long)param + lVar8 + 0x54);
              uVar1 = iVar5 + 1;
              *(uint *)((long)param + lVar8 + 0x54) = uVar1;
              *(undefined4 *)((long)param + lVar8 + 0x58) = 0;
              *(undefined1 *)((long)param + lVar8 + 99) =
                   *(undefined1 *)((long)param + lVar8 + 0x62);
              cVar3 = *(char *)(lVar4 + (ulong)uVar1);
              if (cVar3 == '\0') {
                *(undefined1 *)((long)param + lVar8 + 100) = 0;
              }
              else {
                *(char *)((long)param + lVar8 + 0x66) = cVar3 + -0x80;
              }
              cVar3 = *(char *)(lVar4 + (ulong)(iVar5 + 2));
              if (cVar3 != '\0') {
                *(char *)((long)param + lVar8 + 0x67) = cVar3 + -0x80;
              }
            }
          }
          lVar8 = lVar8 + 0x1c;
        } while (lVar8 != 0x70);
        __s[uVar6] = iVar7 >> 2;
        __s_00[uVar6] = iVar7 >> 2;
        uVar6 = uVar6 + 1;
      } while (uVar6 != samples);
    }
    return;
  }
  memset(__s,0,(ulong)samples << 2);
  memset(__s_00,0,(ulong)samples << 2);
  return;
}

Assistant:

static void IremGA20_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	ga20_state *chip = (ga20_state *)param;
	DEV_SMPL *outL, *outR;
	UINT32 i;
	int j;
	DEV_SMPL smpl_int;
	DEV_SMPL sampleout;
	struct IremGA20_channel_def* ch;

	outL = outputs[0];
	outR = outputs[1];
	if (chip->rom == NULL)
	{
		memset(outL, 0, samples * sizeof(DEV_SMPL));
		memset(outR, 0, samples * sizeof(DEV_SMPL));
		return;
	}

	for (i = 0; i < samples; i++)
	{
		sampleout = 0;

		for (j = 0; j < 4; j++)
		{
			ch = &chip->channel[j];
			if (ch->Muted || ! ch->play)
				continue;
			
			if (! chip->interpolate)
			{
				sampleout += ch->smpl1 * (INT32)ch->volume;
			}
			else
			{
				smpl_int = (ch->smpl1 * ((1 << RATE_SHIFT) - ch->frac) + ch->smpl2 * ch->frac);
				sampleout += (smpl_int * (INT32)ch->volume) >> RATE_SHIFT;
			}
			ch->frac += ch->fracrate;
			ch->counter ++;
			if (! ch->counter)
			{
				// advance position + reset counter on overflow
				ch->pos ++;
				ch->frac = 0;
				ch->counter = ch->rate;
				irem_ga20_cache_samples(chip, ch);
			}
		}

		sampleout >>= 2;
		outL[i] = sampleout;
		outR[i] = sampleout;
	}
}